

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

void __thiscall correctness_add_long_pow2_Test::TestBody(correctness_add_long_pow2_Test *this)

{
  char *pcVar1;
  AssertHelper AStack_208;
  AssertionResult gtest_ar;
  big_integer local_1f0;
  string local_1b8;
  big_integer c;
  string local_160;
  string local_140;
  big_integer a;
  big_integer b;
  big_integer local_b0;
  big_integer local_78;
  big_integer local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"18446744073709551616",(allocator<char> *)&b);
  big_integer::big_integer(&a,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"-18446744073709551616",(allocator<char> *)&c);
  big_integer::big_integer(&b,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"36893488147419103232",(allocator<char> *)&local_1f0);
  big_integer::big_integer(&c,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  big_integer::big_integer(&local_40,&a);
  operator+(&local_1f0,&local_40,&a);
  testing::internal::CmpHelperEQ<big_integer,big_integer>
            ((internal *)&gtest_ar,"a + a","c",&local_1f0,&c);
  big_integer::~big_integer(&local_1f0);
  big_integer::~big_integer(&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x1e7,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_208,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_208);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  big_integer::big_integer(&local_78,&b);
  operator+(&local_1f0,&local_78,&c);
  testing::internal::CmpHelperEQ<big_integer,big_integer>
            ((internal *)&gtest_ar,"b + c","a",&local_1f0,&a);
  big_integer::~big_integer(&local_1f0);
  big_integer::~big_integer(&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x1e8,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_208,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_208);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  big_integer::big_integer(&local_b0,&c);
  operator+(&local_1f0,&local_b0,&b);
  testing::internal::CmpHelperEQ<big_integer,big_integer>
            ((internal *)&gtest_ar,"c + b","a",&local_1f0,&a);
  big_integer::~big_integer(&local_1f0);
  big_integer::~big_integer(&local_b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x1e9,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_208,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_208);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  big_integer::~big_integer(&c);
  big_integer::~big_integer(&b);
  big_integer::~big_integer(&a);
  return;
}

Assistant:

TEST(correctness, add_long_pow2)
{
    big_integer a( "18446744073709551616");
    big_integer b("-18446744073709551616");
    big_integer c( "36893488147419103232");

    EXPECT_EQ(a + a, c);
    EXPECT_EQ(b + c, a);
    EXPECT_EQ(c + b, a);
}